

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O1

void __thiscall
cmScriptGenerator::GenerateScriptActionsPerConfig(cmScriptGenerator *this,ostream *os,Indent indent)

{
  char *pcVar1;
  bool bVar2;
  cmScriptGenerator *pcVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  undefined4 in_register_00000014;
  ulong uVar7;
  char *pcVar8;
  uint uVar9;
  pointer pbVar10;
  string config_test;
  allocator local_89;
  ulong local_88;
  cmScriptGenerator *local_80;
  uint local_74;
  string local_70;
  string local_50;
  
  local_88 = CONCAT44(in_register_00000014,indent.Level);
  pbVar10 = (this->ConfigurationTypes->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar10 ==
      (this->ConfigurationTypes->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    GenerateScriptActionsOnce(this,os,indent);
    return;
  }
  if (pbVar10 !=
      (this->ConfigurationTypes->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_74 = indent.Level + 2;
    bVar2 = true;
    local_80 = this;
    do {
      pcVar1 = (pbVar10->_M_dataplus)._M_p;
      std::__cxx11::string::string((string *)&local_70,pcVar1,(allocator *)&local_50);
      bVar4 = GeneratesForConfig(local_80,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (bVar4) {
        std::__cxx11::string::string((string *)&local_50,pcVar1,&local_89);
        CreateConfigTest(&local_70,local_80,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (0 < (int)local_88) {
          uVar7 = local_88 & 0xffffffff;
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            uVar9 = (int)uVar7 - 1;
            uVar7 = (ulong)uVar9;
          } while (uVar9 != 0);
        }
        pcVar8 = "elseif(";
        if (bVar2) {
          pcVar8 = "if(";
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar8,(ulong)(byte)~bVar2 * 4 + 3);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,local_70._M_dataplus._M_p,local_70._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
        std::__cxx11::string::string((string *)&local_50,pcVar1,&local_89);
        (*local_80->_vptr_cmScriptGenerator[5])(local_80,os,&local_50,(ulong)local_74);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        bVar2 = false;
      }
      pcVar3 = local_80;
      uVar7 = local_88;
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 !=
             (local_80->ConfigurationTypes->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
    if (!bVar2) {
      iVar5 = (*local_80->_vptr_cmScriptGenerator[7])(local_80);
      if ((char)iVar5 != '\0') {
        if (0 < (int)uVar7) {
          uVar7 = local_88 & 0xffffffff;
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            uVar9 = (int)uVar7 - 1;
            uVar7 = (ulong)uVar9;
          } while (uVar9 != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"else()\n",7);
        (*pcVar3->_vptr_cmScriptGenerator[6])(pcVar3,os,(ulong)local_74);
        uVar7 = local_88;
      }
      if (0 < (int)uVar7) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          uVar9 = (int)uVar7 - 1;
          uVar7 = (ulong)uVar9;
        } while (uVar9 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
    }
  }
  return;
}

Assistant:

void cmScriptGenerator::GenerateScriptActionsPerConfig(std::ostream& os,
                                                       Indent indent)
{
  if (this->ConfigurationTypes->empty()) {
    // In a single-configuration generator there is only one action
    // and it applies if the runtime-requested configuration is among
    // the rule's allowed configurations.  The configuration built in
    // the tree does not matter for this decision but will be used to
    // generate proper target file names into the code.
    this->GenerateScriptActionsOnce(os, indent);
  } else {
    // In a multi-configuration generator we produce a separate rule
    // in a block for each configuration that is built.  We restrict
    // the list of configurations to those to which this rule applies.
    bool first = true;
    for (std::vector<std::string>::const_iterator i =
           this->ConfigurationTypes->begin();
         i != this->ConfigurationTypes->end(); ++i) {
      const char* config = i->c_str();
      if (this->GeneratesForConfig(config)) {
        // Generate a per-configuration block.
        std::string config_test = this->CreateConfigTest(config);
        os << indent << (first ? "if(" : "elseif(") << config_test << ")\n";
        this->GenerateScriptForConfig(os, config, indent.Next());
        first = false;
      }
    }
    if (!first) {
      if (this->NeedsScriptNoConfig()) {
        os << indent << "else()\n";
        this->GenerateScriptNoConfig(os, indent.Next());
      }
      os << indent << "endif()\n";
    }
  }
}